

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_action.cpp
# Opt level: O2

int AF_AActor_A_QueueCorpse
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  bool bVar1;
  DCorpsePointer *this;
  AActor *ptr;
  char *__assertion;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_004a7182;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    ptr = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (ptr != (AActor *)0x0) {
        bVar1 = DObject::IsKindOf((DObject *)ptr,AActor::RegistrationInfo.MyClass);
        if (!bVar1) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_004a7182;
        }
        goto LAB_004a7149;
      }
    }
    else if (ptr != (AActor *)0x0) goto LAB_004a7172;
    ptr = (AActor *)0x0;
LAB_004a7149:
    if (0 < sv_corpsequeuesize.Value) {
      this = (DCorpsePointer *)DObject::operator_new(0x48);
      DCorpsePointer::DCorpsePointer(this,ptr);
    }
    return 0;
  }
LAB_004a7172:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_004a7182:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_shared/a_action.cpp"
                ,0x136,
                "int AF_AActor_A_QueueCorpse(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_QueueCorpse)
{
	PARAM_SELF_PROLOGUE(AActor);

	if (sv_corpsequeuesize > 0)
	{
		new DCorpsePointer (self);
	}
	return 0;
}